

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::BaseDictionary(BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *this,BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *other)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  DictionaryStats *pDVar4;
  undefined4 *puVar5;
  Type piVar6;
  EntryType *pEVar7;
  
  this->alloc = other->alloc;
  if (other->count == other->freeCount) {
    this->size = 0;
    this->bucketCount = 0;
    this->count = 0;
    this->freeCount = 0;
    this->modFunctionIndex = 0x4b;
    this->buckets = (Type)0x0;
    this->entries = (Type)0x0;
    pDVar4 = (DictionaryStats *)0x0;
  }
  else {
    if (other->bucketCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xad,"(other.bucketCount != 0)","other.bucketCount != 0");
      if (!bVar3) goto LAB_004b655a;
      *puVar5 = 0;
    }
    if (other->size == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xae,"(other.size != 0)","other.size != 0");
      if (!bVar3) goto LAB_004b655a;
      *puVar5 = 0;
    }
    if ((ulong)other->bucketCount == 0) {
      piVar6 = (Type)&DAT_00000008;
    }
    else {
      piVar6 = (Type)new__<Memory::JitArenaAllocator>
                               ((ulong)other->bucketCount << 2,this->alloc,0x3f1274);
    }
    this->buckets = piVar6;
    if (piVar6 == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xb1,"(buckets)","buckets");
      if (!bVar3) goto LAB_004b655a;
      *puVar5 = 0;
    }
    pEVar7 = AllocateEntries(this,other->size,false);
    this->entries = pEVar7;
    if (pEVar7 == (EntryType *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xb6,"(entries)","entries");
      if (!bVar3) {
LAB_004b655a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    this->size = other->size;
    uVar1 = other->bucketCount;
    this->bucketCount = uVar1;
    this->count = other->count;
    this->freeList = other->freeList;
    this->freeCount = other->freeCount;
    this->modFunctionIndex = other->modFunctionIndex;
    Memory::CopyArray<int,int,Memory::Recycler>
              (this->buckets,(ulong)uVar1,other->buckets,(ulong)uVar1);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<unsigned_int,InductionVariable>,InductionVariable,Memory::JitArenaAllocator>
              (this->entries,(long)this->size,other->entries,(long)this->size);
    pDVar4 = DictionaryStats::Create
                       ("PN6JsUtil14BaseDictionaryIj17InductionVariableN6Memory17JitArenaAllocatorE20DictionarySizePolicyI14PowerOf2PolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_17SimpleHashedEntryENS_12NoResizeLockEEE"
                        ,this->size);
  }
  this->stats = pDVar4;
  return;
}

Assistant:

BaseDictionary(const BaseDictionary &other) :
          alloc(other.alloc)
        {
            if(other.Count() == 0)
            {
                size = 0;
                bucketCount = 0;
                buckets = nullptr;
                entries = nullptr;
                count = 0;
                freeCount = 0;
                modFunctionIndex = UNKNOWN_MOD_INDEX;

#if PROFILE_DICTIONARY
                stats = nullptr;
#endif
                return;
            }

            Assert(other.bucketCount != 0);
            Assert(other.size != 0);

            buckets = AllocateBuckets(other.bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            try
            {
                entries = AllocateEntries(other.size, false /* zeroAllocate */);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, other.bucketCount);
                throw;
            }

            size = other.size;
            bucketCount = other.bucketCount;
            count = other.count;
            freeList = other.freeList;
            freeCount = other.freeCount;
            modFunctionIndex = other.modFunctionIndex;

            CopyArray(buckets, bucketCount, other.buckets, bucketCount);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                entries, size, other.entries, size);

#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }